

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  char *pcVar1;
  Iface *pIVar2;
  int iVar3;
  long lVar4;
  Exception *params_1;
  size_t sVar5;
  int *piVar6;
  int extraout_EDX;
  long lVar7;
  char *pcVar8;
  size_t *psVar9;
  int argc_local;
  ProcessContext *local_5b0;
  ulong local_5a8;
  MainFunc *local_5a0;
  Array<kj::StringPtr> params_heap;
  Fault f;
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 local_570;
  DebugComparison<int_&,_int> _kjCondition;
  StringPtr params_stack [8];
  
  _kjCondition.left = &argc_local;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = 0 < argc;
  argc_local = argc;
  if (argc < 1) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0xd4,FAILED,"argc > 0","_kjCondition,",&_kjCondition);
    _::Debug::Fault::fatal(&f);
  }
  local_5a8 = (ulong)(argc - 1);
  lVar4 = 0;
  pcVar8 = "";
  do {
    *(char **)((long)&params_stack[0].content.ptr + lVar4) = "";
    *(undefined8 *)((long)&params_stack[0].content.size_ + lVar4) = 1;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x80);
  local_5b0 = context;
  if ((uint)argc < 10) {
    params_heap.ptr = (StringPtr *)0x0;
    params_heap.size_ = 0;
    params_heap.disposer = (ArrayDisposer *)0x0;
    params_1 = (Exception *)params_stack;
  }
  else {
    params_1 = (Exception *)_::HeapArrayDisposer::allocate<kj::StringPtr>(local_5a8);
    params_heap.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    params_heap.ptr = (StringPtr *)params_1;
    params_heap.size_ = local_5a8;
  }
  lVar7 = (long)argc_local;
  psVar9 = &(params_1->ownFile).content.size_;
  local_5a0 = func;
  for (lVar4 = 1; lVar4 < lVar7; lVar4 = lVar4 + 1) {
    pcVar1 = argv[lVar4];
    sVar5 = strlen(pcVar1);
    ((ArrayPtr<const_char> *)(psVar9 + -1))->ptr = pcVar1;
    *psVar9 = sVar5 + 1;
    psVar9 = psVar9 + 2;
  }
  pcVar1 = *argv;
  sVar5 = strlen(pcVar1);
  pIVar2 = (local_5a0->impl).ptr;
  (**pIVar2->_vptr_Iface)(pIVar2,pcVar1,sVar5 + 1,params_1,local_5a8);
  f.exception._0_1_ = 0;
  _::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition,(NullableValue<kj::Exception> *)&f);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
  if ((char)_kjCondition.left == '\x01') {
    str<char_const(&)[28],kj::Exception&>
              ((String *)&f,(kj *)"*** Uncaught exception ***\n",(char (*) [28])&_kjCondition.right,
               params_1);
    if (local_570.value.ownFile.content.ptr != (char *)0x0) {
      pcVar8 = (char *)CONCAT71(f.exception._1_7_,f.exception._0_1_);
    }
    (*local_5b0->_vptr_ProcessContext[3])
              (local_5b0,pcVar8,
               local_570.value.ownFile.content.ptr +
               (local_570.value.ownFile.content.ptr == (char *)0x0));
    Array<char>::~Array((Array<char> *)&f);
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  iVar3 = (*local_5b0->_vptr_ProcessContext[1])();
  Array<char>::~Array((Array<char> *)&f);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  Array<kj::StringPtr>::~Array(&params_heap);
  if (extraout_EDX == 1) {
    piVar6 = (int *)__cxa_begin_catch();
    iVar3 = *piVar6;
    __cxa_end_catch();
    return iVar3;
  }
  _Unwind_Resume(iVar3);
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

  try {
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_SOME(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", exception));
    }
    context.exit();
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}